

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyManager.cpp
# Opt level: O0

void __thiscall Types::Types(Types *this)

{
  Types *this_local;
  
  std::
  map<unsigned_long,_Node_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Node_*>_>_>
  ::map(&this->elements);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set(&this->elements2);
  return;
}

Assistant:

Types::Types() {
//	counter = 0;

}